

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::createMutableCubeArrayColor
          (TextureCubeMapArrayStencilAttachments *this,GLuint test_index)

{
  code *pcVar1;
  int iVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  deUint32 err;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  GLubyte *pGVar7;
  Functions *gl;
  GLuint test_index_local;
  TextureCubeMapArrayStencilAttachments *this_local;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar6->_vptr_RenderContext[3])();
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x1320);
  GVar3 = CubeMapArrayDataStorage::getWidth(this->m_cube_map_array_data + test_index);
  GVar4 = CubeMapArrayDataStorage::getHeight(this->m_cube_map_array_data + test_index);
  GVar5 = CubeMapArrayDataStorage::getDepth(this->m_cube_map_array_data + test_index);
  pGVar7 = CubeMapArrayDataStorage::getDataArray(this->m_cube_map_array_data + test_index);
  (*pcVar1)(0x9009,0,0x8058,GVar3,GVar4,GVar5,0,0x1908,0x1401,pGVar7);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"Could not create a mutable color texture storage!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x23a);
  return;
}

Assistant:

void TextureCubeMapArrayStencilAttachments::createMutableCubeArrayColor(glw::GLuint test_index)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY,						 /* target */
				  0,												 /* level */
				  GL_RGBA8,											 /* internal format */
				  m_cube_map_array_data[test_index].getWidth(),		 /* width */
				  m_cube_map_array_data[test_index].getHeight(),	 /* height */
				  m_cube_map_array_data[test_index].getDepth(),		 /* depth */
				  0,												 /* border */
				  GL_RGBA,											 /* format */
				  GL_UNSIGNED_BYTE,									 /* type */
				  m_cube_map_array_data[test_index].getDataArray()); /* pixel data */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a mutable color texture storage!");
}